

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void QScroller::ungrabGesture(QObject *target)

{
  QScrollerPrivate *pQVar1;
  QScroller *pQVar2;
  QGraphicsObject *this;
  QObject *unaff_RBX;
  QWidget *widget;
  
  pQVar2 = scroller(unaff_RBX);
  if ((pQVar2 != (QScroller *)0x0) &&
     (pQVar1 = pQVar2->d_ptr, pQVar1->recognizer != (QFlickGestureRecognizer *)0x0)) {
    if ((*(byte *)(*(long *)(target + 8) + 0x30) & 1) == 0) {
      this = (QGraphicsObject *)QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
      if (this != (QGraphicsObject *)0x0) {
        QGraphicsObject::ungrabGesture(this,pQVar1->recognizerType);
      }
    }
    else {
      QWidget::ungrabGesture((QWidget *)target,pQVar1->recognizerType);
    }
    QGestureRecognizer::unregisterRecognizer(pQVar1->recognizerType);
    pQVar1->recognizer = (QFlickGestureRecognizer *)0x0;
  }
  return;
}

Assistant:

void QScroller::ungrabGesture(QObject *target)
{
    QScroller *s = scroller(target);
    if (!s)
        return;

    QScrollerPrivate *sp = s->d_ptr;
    if (!sp->recognizer)
        return; // nothing to do

    if (target->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(target);
        widget->ungrabGesture(sp->recognizerType);
#if QT_CONFIG(graphicsview)
    } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject*>(target)) {
        go->ungrabGesture(sp->recognizerType);
#endif
    }

    QGestureRecognizer::unregisterRecognizer(sp->recognizerType);
    // do not delete the recognizer. The QGestureManager is doing this.
    sp->recognizer = nullptr;
}